

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O0

char * nowide::basic_convert<char,wchar_t>
                 (char *buffer,size_t buffer_size,wchar_t *source_begin,wchar_t *source_end)

{
  code_point value;
  int iVar1;
  size_t width;
  char *pcStack_38;
  code_point c;
  char *rv;
  wchar_t *source_end_local;
  wchar_t *source_begin_local;
  size_t buffer_size_local;
  char *buffer_local;
  
  if (buffer_size == 0) {
    buffer_local = (char *)0x0;
  }
  else {
    source_begin_local = (wchar_t *)(buffer_size - 1);
    source_end_local = source_begin;
    buffer_size_local = (size_t)buffer;
    while (pcStack_38 = buffer, source_end_local != source_end) {
      value = utf::utf_traits<wchar_t,4>::decode<wchar_t_const*>(&source_end_local,source_end);
      if ((value == 0xffffffff) || (value == 0xfffffffe)) {
        pcStack_38 = (char *)0x0;
        break;
      }
      iVar1 = utf::utf_traits<char,_1>::width(value);
      if (source_begin_local < (wchar_t *)(long)iVar1) {
        pcStack_38 = (char *)0x0;
        break;
      }
      buffer_size_local =
           (size_t)utf::utf_traits<char,1>::encode<char*>(value,(char *)buffer_size_local);
      source_begin_local = (wchar_t *)((long)source_begin_local - (long)iVar1);
    }
    *(undefined1 *)buffer_size_local = 0;
    buffer_local = pcStack_38;
  }
  return buffer_local;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }